

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSpinMutex.h
# Opt level: O0

void HighsSpinMutex::yieldProcessor(void)

{
  return;
}

Assistant:

static void yieldProcessor() {
#ifdef HIGHS_HAVE_MM_PAUSE
    _mm_pause();
#else
    // ToDo: See if this is OK on Mac M1
    std::this_thread::yield();
#endif
  }